

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

char * escape_string(Curl_easy *data,char *src,mimestrategy strategy)

{
  CURLcode CVar1;
  char *pcVar2;
  char **ppcVar3;
  char **ppcVar4;
  dynbuf db;
  dynbuf local_40;
  
  if ((strategy == MIMESTRATEGY_MAIL) ||
     ((ppcVar4 = escape_string::formtable, data != (Curl_easy *)0x0 &&
      (((data->set).mime_options & 1) != 0)))) {
    ppcVar4 = escape_string::mimetable;
  }
  Curl_dyn_init(&local_40,8000000);
  CVar1 = Curl_dyn_addn(&local_40,"",0);
  if (CVar1 == CURLE_OK) {
    do {
      if (*src == '\0') break;
      pcVar2 = *ppcVar4;
      ppcVar3 = ppcVar4;
      while (ppcVar3 = ppcVar3 + 1, pcVar2 != (char *)0x0) {
        if (*pcVar2 == *src) {
          CVar1 = Curl_dyn_add(&local_40,pcVar2 + 1);
          goto LAB_0059a3fc;
        }
        pcVar2 = *ppcVar3;
      }
      CVar1 = Curl_dyn_addn(&local_40,src,1);
LAB_0059a3fc:
      src = src + 1;
    } while (CVar1 == CURLE_OK);
  }
  pcVar2 = Curl_dyn_ptr(&local_40);
  return pcVar2;
}

Assistant:

static char *escape_string(struct Curl_easy *data,
                           const char *src, enum mimestrategy strategy)
{
  CURLcode result;
  struct dynbuf db;
  const char * const *table;
  const char * const *p;
  /* replace first character by rest of string. */
  static const char * const mimetable[] = {
    "\\\\\\",
    "\"\\\"",
    NULL
  };
  /* WHATWG HTML living standard 4.10.21.8 2 specifies:
     For field names and filenames for file fields, the result of the
     encoding in the previous bullet point must be escaped by replacing
     any 0x0A (LF) bytes with the byte sequence `%0A`, 0x0D (CR) with `%0D`
     and 0x22 (") with `%22`.
     The user agent must not perform any other escapes. */
  static const char * const formtable[] = {
    "\"%22",
    "\r%0D",
    "\n%0A",
    NULL
  };

  table = formtable;
  /* data can be NULL when this function is called indirectly from
     curl_formget(). */
  if(strategy == MIMESTRATEGY_MAIL ||
     (data && (data->set.mime_options & CURLMIMEOPT_FORMESCAPE)))
    table = mimetable;

  Curl_dyn_init(&db, CURL_MAX_INPUT_LENGTH);

  for(result = Curl_dyn_addn(&db, STRCONST("")); !result && *src; src++) {
    for(p = table; *p && **p != *src; p++)
      ;

    if(*p)
      result = Curl_dyn_add(&db, *p + 1);
    else
      result = Curl_dyn_addn(&db, src, 1);
  }

  return Curl_dyn_ptr(&db);
}